

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  bool bVar1;
  ImGuiTextRange *this_00;
  char *pcVar2;
  ImGuiTextRange *f;
  int i;
  char *text_end_local;
  char *text_local;
  ImGuiTextFilter *this_local;
  
  bVar1 = ImVector<ImGuiTextFilter::ImGuiTextRange>::empty(&this->Filters);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    text_end_local = text;
    if (text == (char *)0x0) {
      text_end_local = "";
    }
    for (f._4_4_ = 0; f._4_4_ != (this->Filters).Size; f._4_4_ = f._4_4_ + 1) {
      this_00 = ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](&this->Filters,f._4_4_);
      bVar1 = ImGuiTextRange::empty(this_00);
      if (!bVar1) {
        if (*this_00->b == '-') {
          pcVar2 = ImStristr(text_end_local,text_end,this_00->b + 1,this_00->e);
          if (pcVar2 != (char *)0x0) {
            return false;
          }
        }
        else {
          pcVar2 = ImStristr(text_end_local,text_end,this_00->b,this_00->e);
          if (pcVar2 != (char *)0x0) {
            return true;
          }
        }
      }
    }
    if (this->CountGrep == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ImGuiTextFilter::PassFilter(const char* text, const char* text_end) const
{
    if (Filters.empty())
        return true;

    if (text == NULL)
        text = "";

    for (int i = 0; i != Filters.Size; i++)
    {
        const ImGuiTextRange& f = Filters[i];
        if (f.empty())
            continue;
        if (f.b[0] == '-')
        {
            // Subtract
            if (ImStristr(text, text_end, f.b + 1, f.e) != NULL)
                return false;
        }
        else
        {
            // Grep
            if (ImStristr(text, text_end, f.b, f.e) != NULL)
                return true;
        }
    }

    // Implicit * grep
    if (CountGrep == 0)
        return true;

    return false;
}